

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sumFinalize(sqlite3_context *context)

{
  Mem *pMem;
  double *pdVar1;
  
  if ((short)context->pMem->flags < 0) {
    pdVar1 = (double *)context->pMem->z;
  }
  else {
    pdVar1 = (double *)createAggContext(context,0);
  }
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[2])) {
    if (*(char *)(pdVar1 + 3) != '\0') {
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,"integer overflow",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    if (*(char *)((long)pdVar1 + 0x19) != '\0') {
      sqlite3VdbeMemSetDouble(context->pOut,*pdVar1);
      return;
    }
    pMem = context->pOut;
    if ((pMem->flags & 0x9000) != 0) {
      vdbeReleaseAndSetInt64(pMem,(i64)pdVar1[1]);
      return;
    }
    (pMem->u).i = (i64)pdVar1[1];
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void sumFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    if( p->overflow ){
      sqlite3_result_error(context,"integer overflow",-1);
    }else if( p->approx ){
      sqlite3_result_double(context, p->rSum);
    }else{
      sqlite3_result_int64(context, p->iSum);
    }
  }
}